

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweeper_kba_kernels.h
# Opt level: O0

int Sweeper_thread_octant(SweeperLite *sweeper)

{
  ulong uVar1;
  Bool_t BVar2;
  int iVar3;
  SweeperLite *sweeper_local;
  
  if (sweeper->nthread_e * sweeper->nthread_octant * sweeper->nthread_y * sweeper->nthread_z != 1) {
    BVar2 = Env_omp_in_parallel();
    if (BVar2 == 0) {
      __assert_fail("sweeper->nthread_e * sweeper->nthread_octant * sweeper->nthread_y * sweeper->nthread_z == 1 || Env_omp_in_parallel()"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/sweeper_kba_kernels.h"
                    ,0x8f,"int Sweeper_thread_octant(const SweeperLite *)");
    }
  }
  iVar3 = Env_omp_thread();
  uVar1 = (long)iVar3 / (long)sweeper->nthread_e;
  return (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) %
              (long)sweeper->nthread_octant);
}

Assistant:

TARGET_HD static inline int Sweeper_thread_octant( const SweeperLite* sweeper )
{
#ifdef USE_OPENMP_TASKS
  Assert(sweeper->thread_octant >= 0);
  return sweeper->thread_octant;
#else
#ifdef __CUDA_ARCH__
  return Env_cuda_thread_in_threadblock( 1 );
#else
  Assert( sweeper->nthread_e *
          sweeper->nthread_octant *
          sweeper->nthread_y *
          sweeper->nthread_z == 1 || Env_omp_in_parallel() );
  return ( Env_omp_thread() / sweeper->nthread_e )
                            % sweeper->nthread_octant;
#endif
#endif
}